

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  ImDrawCmd *pIVar1;
  float fVar2;
  char cVar3;
  uint uVar4;
  ImDrawIdx *pIVar5;
  ImDrawVert *pIVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  ImFontGlyph *pIVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  ImDrawIdx IVar15;
  char *text_end_00;
  float fVar16;
  float fVar17;
  float fVar18;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float local_bc;
  uint c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ImDrawIdx *local_78;
  ImDrawVert *local_70;
  int local_64;
  int local_60;
  ImU32 local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ulong local_48;
  char *local_40;
  ImVector<unsigned_short> *local_38;
  
  fVar17 = pos.x;
  fVar16 = pos.y;
  local_5c = col;
  if (text_end == (char *)0x0) {
    fStack_80 = in_XMM1_Dc;
    local_88 = pos;
    fStack_7c = in_XMM1_Dd;
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
    fVar17 = (float)local_88._0_4_;
    fVar16 = (float)local_88._4_4_;
    in_XMM1_Dc = fStack_80;
    in_XMM1_Dd = fStack_7c;
  }
  fVar19 = (float)(int)fVar16 + (this->DisplayOffset).y;
  fVar21 = clip_rect->w;
  if (fVar19 <= fVar21) {
    fStack_54 = (float)(int)fVar16;
    fStack_50 = (float)(int)in_XMM1_Dc;
    fStack_4c = (float)(int)in_XMM1_Dd;
    local_58 = (float)(int)fVar17 + (this->DisplayOffset).x;
    fVar16 = size / this->FontSize;
    fVar17 = this->FontSize * fVar16;
    local_88._0_4_ = fVar17;
    if ((wrap_width <= 0.0) && (fVar28 = clip_rect->y, fVar19 + fVar17 < fVar28)) {
      while ((fVar18 = fVar17 + fVar19, fVar18 < fVar28 && (text_begin < text_end))) {
        pvVar9 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar9 + 1);
        fVar17 = (float)local_88._0_4_;
        fVar19 = fVar18;
        if (pvVar9 == (void *)0x0) {
          text_begin = text_end;
        }
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar10 = text_begin, fVar17 = fVar19, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar10, fVar17 < fVar21 && (pcVar10 < text_end))) {
        pvVar9 = memchr(pcVar10,10,(long)text_end - (long)pcVar10);
        pcVar10 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          pcVar10 = text_end;
        }
        fVar17 = fVar17 + (float)local_88._0_4_;
      }
    }
    if (text_begin != text_end_00) {
      iVar12 = (int)text_end_00 - (int)text_begin;
      local_60 = iVar12 * 6;
      local_38 = &draw_list->IdxBuffer;
      local_64 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_60,iVar12 * 4);
      local_70 = draw_list->_VtxWritePtr;
      local_78 = draw_list->_IdxWritePtr;
      local_48 = (ulong)draw_list->_VtxCurrentIdx;
      local_40 = (char *)0x0;
      local_bc = local_58;
      pcVar10 = local_40;
      fVar17 = (float)local_88._0_4_;
      fVar21 = local_58;
      fVar28 = fVar19;
      pcVar13 = text_begin;
LAB_0012e3c1:
      do {
        if (text_end_00 <= text_begin) break;
        pcVar14 = pcVar13;
        fVar18 = fVar28;
        fVar2 = local_bc;
        pcVar7 = local_40;
        if (0.0 < wrap_width) {
          if (pcVar10 == (char *)0x0) {
            pcVar10 = CalcWordWrapPositionA
                                (this,fVar16,text_begin,text_end_00,(local_58 - fVar21) + wrap_width
                                );
            pcVar10 = pcVar10 + (pcVar10 == text_begin);
            fVar17 = (float)local_88._0_4_;
          }
          pcVar14 = text_begin;
          fVar18 = fVar19;
          fVar2 = fVar21;
          pcVar7 = pcVar10;
          if (pcVar10 <= text_begin) {
            fVar19 = fVar19 + fVar17;
            pcVar10 = text_begin;
            do {
              text_begin = pcVar10;
              fVar21 = local_58;
              if (text_end_00 <= text_begin) {
                pcVar10 = (char *)0x0;
                goto LAB_0012e3c1;
              }
              cVar3 = *text_begin;
              pcVar10 = text_begin + 1;
            } while ((cVar3 == '\t') || (cVar3 == ' '));
            pcVar14 = text_begin + 1;
            if (cVar3 != '\n') {
              pcVar14 = text_begin;
            }
            pcVar10 = (char *)0x0;
            text_begin = pcVar14;
            goto LAB_0012e3c1;
          }
        }
        local_40 = pcVar7;
        local_bc = fVar2;
        fVar19 = fVar18;
        c = (uint)*pcVar14;
        if (*pcVar14 < '\0') {
          iVar12 = ImTextCharFromUtf8(&c,pcVar14,text_end_00);
          if (c == 0) break;
          text_begin = pcVar14 + iVar12;
          fVar17 = (float)local_88._0_4_;
        }
        else {
          text_begin = pcVar14 + 1;
        }
        uVar4 = c;
        fVar28 = fVar19;
        pcVar13 = text_begin;
        if (0x1f < c) {
LAB_0012e512:
          pIVar11 = FindGlyph(this,(ImWchar)c);
          if (pIVar11 == (ImFontGlyph *)0x0) {
            fVar17 = 0.0;
          }
          else {
            fVar17 = pIVar11->AdvanceX * fVar16;
            if ((uVar4 != 9) && (uVar4 != 0x20)) {
              fVar18 = pIVar11->X0 * fVar16 + local_bc;
              fVar21 = clip_rect->z;
              if (fVar18 <= fVar21) {
                fVar26 = pIVar11->X1 * fVar16 + local_bc;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar26) {
                  fVar27 = pIVar11->Y0 * fVar16 + fVar19;
                  fVar23 = pIVar11->Y1 * fVar16 + fVar19;
                  fVar20 = pIVar11->U0;
                  fVar25 = pIVar11->V0;
                  fVar24 = pIVar11->U1;
                  fVar22 = pIVar11->V1;
                  if (cpu_fine_clip) {
                    if (fVar18 < fVar2) {
                      fVar20 = fVar20 + (fVar24 - fVar20) *
                                        (1.0 - (fVar26 - fVar2) / (fVar26 - fVar18));
                      fVar18 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar27 < fVar2) {
                      fVar25 = fVar25 + (fVar22 - fVar25) *
                                        (1.0 - (fVar23 - fVar2) / (fVar23 - fVar27));
                      fVar27 = fVar2;
                    }
                    if (fVar21 < fVar26) {
                      fVar24 = (fVar24 - fVar20) * ((fVar21 - fVar18) / (fVar26 - fVar18)) + fVar20;
                      fVar26 = fVar21;
                    }
                    fVar21 = clip_rect->w;
                    if (fVar21 < fVar23) {
                      fVar22 = (fVar22 - fVar25) * ((fVar21 - fVar27) / (fVar23 - fVar27)) + fVar25;
                      fVar23 = fVar21;
                    }
                    if (fVar23 <= fVar27) goto LAB_0012e638;
                  }
                  IVar15 = (ImDrawIdx)local_48;
                  *local_78 = IVar15;
                  local_78[1] = IVar15 + 1;
                  local_78[2] = IVar15 + 2;
                  local_78[3] = IVar15;
                  local_78[4] = IVar15 + 2;
                  local_78[5] = IVar15 + 3;
                  (local_70->pos).x = fVar18;
                  (local_70->pos).y = fVar27;
                  local_70->col = local_5c;
                  (local_70->uv).x = fVar20;
                  (local_70->uv).y = fVar25;
                  local_70[1].pos.x = fVar26;
                  local_70[1].pos.y = fVar27;
                  local_70[1].col = local_5c;
                  local_70[1].uv.x = fVar24;
                  local_70[1].uv.y = fVar25;
                  local_70[2].pos.x = fVar26;
                  local_70[2].pos.y = fVar23;
                  local_70[2].col = local_5c;
                  local_70[2].uv.x = fVar24;
                  local_70[2].uv.y = fVar22;
                  local_70[3].pos.x = fVar18;
                  local_70[3].pos.y = fVar23;
                  local_70[3].col = local_5c;
                  local_70[3].uv.x = fVar20;
                  local_70[3].uv.y = fVar22;
                  local_70 = local_70 + 4;
                  local_48 = (ulong)((int)local_48 + 4);
                  local_78 = local_78 + 6;
                }
              }
            }
          }
LAB_0012e638:
          local_bc = local_bc + fVar17;
          pcVar10 = local_40;
          fVar17 = (float)local_88._0_4_;
          fVar21 = local_bc;
          goto LAB_0012e3c1;
        }
        pcVar10 = local_40;
        if (c != 10) {
          fVar21 = local_bc;
          if (c != 0xd) goto LAB_0012e512;
          goto LAB_0012e3c1;
        }
        fVar19 = fVar19 + fVar17;
        local_bc = local_58;
        fVar21 = local_58;
        fVar28 = fVar19;
      } while (fVar19 < clip_rect->w || fVar19 == clip_rect->w);
      pIVar6 = local_70;
      ImVector<ImDrawVert>::resize
                (&draw_list->VtxBuffer,
                 (int)(((long)local_70 - (long)(draw_list->VtxBuffer).Data) / 0x14));
      pIVar5 = local_78;
      ImVector<unsigned_short>::resize
                (local_38,(int)((ulong)((long)local_78 - (long)(draw_list->IdxBuffer).Data) >> 1));
      pIVar1 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
      pIVar1->ElemCount = pIVar1->ElemCount + ((draw_list->IdxBuffer).Size - (local_64 + local_60));
      draw_list->_VtxWritePtr = pIVar6;
      draw_list->_IdxWritePtr = pIVar5;
      draw_list->_VtxCurrentIdx = (draw_list->VtxBuffer).Size;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((ImWchar)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}